

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O0

ScopeCtx *
wasm::IRBuilder::ScopeCtx::makeCatch(ScopeCtx *__return_storage_ptr__,ScopeCtx *scope,Try *tryy)

{
  CatchScope local_38;
  Try *local_20;
  Try *tryy_local;
  ScopeCtx *scope_local;
  
  local_38.tryy = tryy;
  local_20 = tryy;
  tryy_local = (Try *)scope;
  scope_local = __return_storage_ptr__;
  local_38.originalLabel = getOriginalLabel(scope);
  std::
  variant<wasm::IRBuilder::ScopeCtx::NoScope,wasm::IRBuilder::ScopeCtx::FuncScope,wasm::IRBuilder::ScopeCtx::BlockScope,wasm::IRBuilder::ScopeCtx::IfScope,wasm::IRBuilder::ScopeCtx::ElseScope,wasm::IRBuilder::ScopeCtx::LoopScope,wasm::IRBuilder::ScopeCtx::TryScope,wasm::IRBuilder::ScopeCtx::CatchScope,wasm::IRBuilder::ScopeCtx::CatchAllScope,wasm::IRBuilder::ScopeCtx::TryTableScope>
  ::operator=((variant<wasm::IRBuilder::ScopeCtx::NoScope,wasm::IRBuilder::ScopeCtx::FuncScope,wasm::IRBuilder::ScopeCtx::BlockScope,wasm::IRBuilder::ScopeCtx::IfScope,wasm::IRBuilder::ScopeCtx::ElseScope,wasm::IRBuilder::ScopeCtx::LoopScope,wasm::IRBuilder::ScopeCtx::TryScope,wasm::IRBuilder::ScopeCtx::CatchScope,wasm::IRBuilder::ScopeCtx::CatchAllScope,wasm::IRBuilder::ScopeCtx::TryTableScope>
               *)tryy_local,&local_38);
  resetForDelimiter((ScopeCtx *)tryy_local,false);
  ScopeCtx(__return_storage_ptr__,(ScopeCtx *)tryy_local);
  return __return_storage_ptr__;
}

Assistant:

static ScopeCtx makeCatch(ScopeCtx&& scope, Try* tryy) {
      scope.scope = CatchScope{tryy, scope.getOriginalLabel()};
      scope.resetForDelimiter(/*keepInput=*/false);
      return scope;
    }